

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
          (Marray<unsigned_char,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,uchar *value,CoordinateOrder *coordinateOrder,allocator_type *allocator
          )

{
  size_t j;
  unsigned_long *puVar1;
  pointer data;
  ulong uVar2;
  runtime_error *this_00;
  ulong uVar3;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<unsigned_char,std::allocator<unsigned_long>>)0x1;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  uVar3 = 1;
  puVar1 = begin;
  if (begin != end) {
    do {
      uVar3 = uVar3 * *puVar1;
      puVar1 = puVar1 + 1;
    } while (puVar1 != end);
  }
  if (uVar3 != 0) {
    if (-1 < (long)uVar3) {
      data = (pointer)operator_new(uVar3);
      View<unsigned_char,false,std::allocator<unsigned_long>>::assign<unsigned_long_const*>
                ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,begin,end,data,
                 coordinateOrder,coordinateOrder,allocator);
      uVar2 = 0;
      do {
        *(uchar *)(*(long *)this + uVar2) = *value;
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
      View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
      if (this[0x3c] != (Marray<unsigned_char,std::allocator<unsigned_long>>)0x0) {
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
      goto LAB_00103ab7;
    }
    std::__throw_bad_alloc();
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_00103ab7:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
)
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    for(std::size_t j=0; j<size; ++j) {
        this->data_[j] = value;
    }
    testInvariant();
}